

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTetra>::Print
          (TPZCompElHDiv<pzshape::TPZShapeTetra> *this,ostream *out)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  const_iterator out_00;
  TPZOneShapeRestraint *in_RSI;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *in_RDI;
  TPZVec<int> *in_stack_00000008;
  ostream *in_stack_00000010;
  const_iterator it;
  ostream *in_stack_00000138;
  TPZInterpolatedElement *in_stack_00000140;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *in_stack_ffffffffffffffc8;
  _Self local_20;
  
  poVar2 = std::operator<<((ostream *)in_RSI,
                           "virtual void TPZCompElHDiv<pzshape::TPZShapeTetra>::Print(std::ostream &) const [TSHAPE = pzshape::TPZShapeTetra]"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  TPZInterpolatedElement::Print(in_stack_00000140,in_stack_00000138);
  std::operator<<((ostream *)in_RSI,"Side orientation ");
  poVar2 = ::operator<<(in_stack_00000010,in_stack_00000008);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::size
                    (in_RDI);
  if (sVar3 != 0) {
    std::operator<<((ostream *)in_RSI,"One shape restraints associated with the element\n");
    out_00 = std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::begin
                       (in_stack_ffffffffffffffc8);
    while( true ) {
      local_20._M_node =
           (_List_node_base *)
           std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::end
                     (in_stack_ffffffffffffffc8);
      bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe8,&local_20);
      if (!bVar1) break;
      std::_List_const_iterator<TPZOneShapeRestraint>::operator->
                ((_List_const_iterator<TPZOneShapeRestraint> *)in_RDI);
      TPZOneShapeRestraint::Print(in_RSI,(ostream *)out_00._M_node);
      std::_List_const_iterator<TPZOneShapeRestraint>::operator++
                ((_List_const_iterator<TPZOneShapeRestraint> *)&stack0xffffffffffffffe8,0);
    }
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Print(std::ostream &out) const
{
    out << __PRETTY_FUNCTION__ << std::endl;
    TPZIntelGen<TSHAPE>::Print(out);
    out << "Side orientation " << fSideOrient << std::endl;
    if (fRestraints.size()) {
        out << "One shape restraints associated with the element\n";
        for (std::list<TPZOneShapeRestraint>::const_iterator it = fRestraints.begin(); it != fRestraints.end(); it++)
        {
            it->Print(out);
        }
    }



}